

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

nk_image * nk_image_id(nk_image *__return_storage_ptr__,int id)

{
  nk_zero(__return_storage_ptr__,0x18);
  (__return_storage_ptr__->handle).id = id;
  __return_storage_ptr__->w = 0;
  __return_storage_ptr__->h = 0;
  __return_storage_ptr__->region[0] = 0;
  __return_storage_ptr__->region[1] = 0;
  __return_storage_ptr__->region[2] = 0;
  __return_storage_ptr__->region[3] = 0;
  return __return_storage_ptr__;
}

Assistant:

NK_API struct nk_image
nk_image_id(int id)
{
    struct nk_image s;
    nk_zero(&s, sizeof(s));
    s.handle.id = id;
    s.w = 0; s.h = 0;
    s.region[0] = 0;
    s.region[1] = 0;
    s.region[2] = 0;
    s.region[3] = 0;
    return s;
}